

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O1

_Bool os_system_linux_is_minimal_kernel(int v1,int v2,int v3)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  char *next;
  utsname uts;
  
  memset(&uts,0,0x186);
  iVar1 = uname((utsname *)&uts);
  if (iVar1 == 0) {
    lVar4 = strtol(uts.release,&next,10);
    if (v1 < (int)lVar4) {
      return true;
    }
    if (v1 <= (int)lVar4) {
      if (*next == '.') {
        lVar4 = strtol(next + 1,&next,10);
        if (v2 < (int)lVar4) {
          return true;
        }
        if ((int)lVar4 < v2) {
          return false;
        }
        if (*next == '.') {
          lVar4 = strtol(next + 1,(char **)0x0,10);
          return v3 <= (int)lVar4;
        }
      }
      if (((&log_global_mask)[_oonf_os_system_subsystem.logging] & 4) != 0) {
        oonf_log(4,(ulong)_oonf_os_system_subsystem.logging,"src/base/os_linux/os_system_linux.c",
                 0xe0,0,0,"Error, cannot parse kernel version: %s\n",uts.release);
        return false;
      }
    }
  }
  else {
    uVar5 = (ulong)_oonf_os_system_subsystem.logging;
    if (((&log_global_mask)[uVar5] & 4) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      oonf_log(4,uVar5,"src/base/os_linux/os_system_linux.c",0xc0,0,0,
               "Error, could not read kernel version: %s (%d)\n",pcVar3,*piVar2);
      return false;
    }
  }
  return false;
}

Assistant:

bool
os_system_linux_is_minimal_kernel(int v1, int v2, int v3) {
  struct utsname uts;
  char *next;
  int first = 0, second = 0, third = 0;

  memset(&uts, 0, sizeof(uts));
  if (uname(&uts)) {
    OONF_WARN(LOG_OS_SYSTEM, "Error, could not read kernel version: %s (%d)\n", strerror(errno), errno);
    return false;
  }

  first = strtol(uts.release, &next, 10);
  /* check for linux 3.x */
  if (first > v1) {
    return true;
  }
  else if (first < v1) {
    return false;
  }

  if (*next != '.') {
    goto kernel_parse_error;
  }

  second = strtol(next + 1, &next, 10);
  if (second > v2) {
    return true;
  }
  if (second < v2) {
    return false;
  }
  if (*next != '.') {
    goto kernel_parse_error;
  }

  third = strtol(next + 1, NULL, 10);
  return third >= v3;

kernel_parse_error:
  OONF_WARN(LOG_OS_SYSTEM, "Error, cannot parse kernel version: %s\n", uts.release);
  return false;
}